

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall
QGraphicsViewPrivate::storeDragDropEvent
          (QGraphicsViewPrivate *this,QGraphicsSceneDragDropEvent *event)

{
  QGraphicsSceneEvent *pQVar1;
  MouseButtons buttons;
  KeyboardModifiers modifiers;
  DropActions actions;
  DropAction DVar2;
  QGraphicsSceneDragDropEvent *pQVar3;
  QPoint QVar4;
  QMimeData *data;
  QWidget *pQVar5;
  quint64 ts;
  long in_FS_OFFSET;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->lastDragDropEvent != (QGraphicsSceneDragDropEvent *)0x0) {
    (**(code **)(*(long *)&this->lastDragDropEvent->super_QGraphicsSceneEvent + 8))();
  }
  pQVar3 = (QGraphicsSceneDragDropEvent *)operator_new(0x18);
  QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
            (pQVar3,(uint)*(ushort *)&(event->super_QGraphicsSceneEvent).field_0x8);
  this->lastDragDropEvent = pQVar3;
  local_38 = QGraphicsSceneDragDropEvent::scenePos(event);
  QGraphicsSceneDragDropEvent::setScenePos(pQVar3,&local_38);
  pQVar3 = this->lastDragDropEvent;
  QVar4 = QGraphicsSceneDragDropEvent::screenPos(event);
  local_38.xp = (qreal)QVar4;
  QGraphicsSceneDragDropEvent::setScreenPos(pQVar3,(QPoint *)&local_38);
  pQVar3 = this->lastDragDropEvent;
  buttons = QGraphicsSceneDragDropEvent::buttons(event);
  QGraphicsSceneDragDropEvent::setButtons(pQVar3,buttons);
  pQVar3 = this->lastDragDropEvent;
  modifiers = QGraphicsSceneDragDropEvent::modifiers(event);
  QGraphicsSceneDragDropEvent::setModifiers(pQVar3,modifiers);
  pQVar3 = this->lastDragDropEvent;
  actions = QGraphicsSceneDragDropEvent::possibleActions(event);
  QGraphicsSceneDragDropEvent::setPossibleActions(pQVar3,actions);
  pQVar3 = this->lastDragDropEvent;
  DVar2 = QGraphicsSceneDragDropEvent::proposedAction(event);
  QGraphicsSceneDragDropEvent::setProposedAction(pQVar3,DVar2);
  pQVar3 = this->lastDragDropEvent;
  DVar2 = QGraphicsSceneDragDropEvent::dropAction(event);
  QGraphicsSceneDragDropEvent::setDropAction(pQVar3,DVar2);
  pQVar3 = this->lastDragDropEvent;
  data = QGraphicsSceneDragDropEvent::mimeData(event);
  QGraphicsSceneDragDropEvent::setMimeData(pQVar3,data);
  pQVar1 = &this->lastDragDropEvent->super_QGraphicsSceneEvent;
  pQVar5 = QGraphicsSceneEvent::widget(&event->super_QGraphicsSceneEvent);
  QGraphicsSceneEvent::setWidget(pQVar1,pQVar5);
  pQVar3 = this->lastDragDropEvent;
  pQVar5 = QGraphicsSceneDragDropEvent::source(event);
  QGraphicsSceneDragDropEvent::setSource(pQVar3,pQVar5);
  pQVar1 = &this->lastDragDropEvent->super_QGraphicsSceneEvent;
  ts = QGraphicsSceneEvent::timestamp(&event->super_QGraphicsSceneEvent);
  QGraphicsSceneEvent::setTimestamp(pQVar1,ts);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::storeDragDropEvent(const QGraphicsSceneDragDropEvent *event)
{
    delete lastDragDropEvent;
    lastDragDropEvent = new QGraphicsSceneDragDropEvent(event->type());
    lastDragDropEvent->setScenePos(event->scenePos());
    lastDragDropEvent->setScreenPos(event->screenPos());
    lastDragDropEvent->setButtons(event->buttons());
    lastDragDropEvent->setModifiers(event->modifiers());
    lastDragDropEvent->setPossibleActions(event->possibleActions());
    lastDragDropEvent->setProposedAction(event->proposedAction());
    lastDragDropEvent->setDropAction(event->dropAction());
    lastDragDropEvent->setMimeData(event->mimeData());
    lastDragDropEvent->setWidget(event->widget());
    lastDragDropEvent->setSource(event->source());
    lastDragDropEvent->setTimestamp(event->timestamp());
}